

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O1

int get_state(void)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = sem_wait((sem_t *)write_sem);
  uVar2 = 0xffffffff;
  if (iVar1 == 0) {
    uVar2 = buf->state;
    iVar1 = sem_post((sem_t *)write_sem);
    uVar2 = -(uint)(iVar1 != 0) | uVar2;
  }
  return uVar2;
}

Assistant:

int get_state()
{
    int i;
    if (sem_wait(write_sem) != 0)
    {
        return -1;
    }
    i = buf->state;
    if (sem_post(write_sem) != 0)
    {
        return -1;
    }
    return i;
}